

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

TcParseTableBase * google::protobuf::Message::GetTcParseTableImpl(MessageLite *msg)

{
  Message *this;
  TcParseTableBase *pTVar1;
  Metadata MVar2;
  
  this = DownCastMessage<google::protobuf::Message>(msg);
  MVar2 = GetMetadata(this);
  pTVar1 = Reflection::GetTcParseTable(MVar2.reflection);
  return pTVar1;
}

Assistant:

const internal::TcParseTableBase* Message::GetTcParseTableImpl(
    const MessageLite& msg) {
  return DownCastMessage<Message>(msg).GetReflection()->GetTcParseTable();
}